

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O1

ImmutablePatternModifier * __thiscall
icu_63::number::impl::MutablePatternModifier::createImmutableAndChain
          (MutablePatternModifier *this,MicroPropsGenerator *parent,UErrorCode *status)

{
  Form FVar1;
  PluralRules *pPVar2;
  int iVar3;
  AdoptingModifierStore *__s;
  ConstantMultiFieldModifier *pCVar4;
  ImmutablePatternModifier *pIVar5;
  UErrorCode *pUVar6;
  long lVar7;
  UErrorCode statusLocal;
  
  __s = (AdoptingModifierStore *)UMemory::operator_new((UMemory *)0x98,(size_t)parent);
  if (__s == (AdoptingModifierStore *)0x0) {
    __s = (AdoptingModifierStore *)0x0;
  }
  else {
    memset(__s,0,0x98);
    (__s->super_ModifierStore)._vptr_ModifierStore =
         (_func_int **)&PTR__AdoptingModifierStore_003d9500;
    memset(__s->mods,0,0x90);
  }
  if (__s == (AdoptingModifierStore *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    iVar3 = (*this->fPatternInfo->_vptr_AffixPatternProvider[9])(this->fPatternInfo,0xfffffff9);
    if ((char)iVar3 == '\0') {
      this->fSignum = '\x01';
      this->fPlural = COUNT;
      pCVar4 = createConstantModifier(this,status);
      __s->mods[0x11] = &pCVar4->super_Modifier;
      this->fSignum = '\0';
      this->fPlural = COUNT;
      pCVar4 = createConstantModifier(this,status);
      __s->mods[0x10] = &pCVar4->super_Modifier;
      this->fSignum = -1;
      this->fPlural = COUNT;
      pUVar6 = status;
      pCVar4 = createConstantModifier(this,status);
      __s->mods[0xf] = &pCVar4->super_Modifier;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pIVar5 = (ImmutablePatternModifier *)UMemory::operator_new((UMemory *)0x20,(size_t)pUVar6);
        if (pIVar5 == (ImmutablePatternModifier *)0x0) {
          return (ImmutablePatternModifier *)0x0;
        }
        (pIVar5->super_MicroPropsGenerator)._vptr_MicroPropsGenerator =
             (_func_int **)&PTR__ImmutablePatternModifier_003d9990;
        (pIVar5->pm).super_LocalPointerBase<icu_63::number::impl::AdoptingModifierStore>.ptr = __s;
        pIVar5->rules = (PluralRules *)0x0;
        pIVar5->parent = parent;
        return pIVar5;
      }
    }
    else {
      lVar7 = 0;
      do {
        FVar1 = *(Form *)((long)createImmutableAndChain::STANDARD_PLURAL_VALUES + lVar7);
        this->fSignum = '\x01';
        this->fPlural = FVar1;
        pCVar4 = createConstantModifier(this,status);
        __s->mods[(long)(int)FVar1 * 3 + 2] = &pCVar4->super_Modifier;
        this->fSignum = '\0';
        this->fPlural = FVar1;
        pCVar4 = createConstantModifier(this,status);
        __s->mods[(long)(int)(FVar1 * 3) + 1] = &pCVar4->super_Modifier;
        this->fSignum = -1;
        this->fPlural = FVar1;
        pUVar6 = status;
        pCVar4 = createConstantModifier(this,status);
        __s->mods[(int)(FVar1 * 3)] = &pCVar4->super_Modifier;
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x18);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pIVar5 = (ImmutablePatternModifier *)UMemory::operator_new((UMemory *)0x20,(size_t)pUVar6);
        if (pIVar5 == (ImmutablePatternModifier *)0x0) {
          return (ImmutablePatternModifier *)0x0;
        }
        pPVar2 = this->fRules;
        (pIVar5->super_MicroPropsGenerator)._vptr_MicroPropsGenerator =
             (_func_int **)&PTR__ImmutablePatternModifier_003d9990;
        (pIVar5->pm).super_LocalPointerBase<icu_63::number::impl::AdoptingModifierStore>.ptr = __s;
        pIVar5->rules = pPVar2;
        pIVar5->parent = parent;
        return pIVar5;
      }
    }
    (*(__s->super_ModifierStore)._vptr_ModifierStore[1])(__s);
  }
  return (ImmutablePatternModifier *)0x0;
}

Assistant:

ImmutablePatternModifier*
MutablePatternModifier::createImmutableAndChain(const MicroPropsGenerator* parent, UErrorCode& status) {

    // TODO: Move StandardPlural VALUES to standardplural.h
    static const StandardPlural::Form STANDARD_PLURAL_VALUES[] = {
            StandardPlural::Form::ZERO,
            StandardPlural::Form::ONE,
            StandardPlural::Form::TWO,
            StandardPlural::Form::FEW,
            StandardPlural::Form::MANY,
            StandardPlural::Form::OTHER};

    auto pm = new AdoptingModifierStore();
    if (pm == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    }

    if (needsPlurals()) {
        // Slower path when we require the plural keyword.
        for (StandardPlural::Form plural : STANDARD_PLURAL_VALUES) {
            setNumberProperties(1, plural);
            pm->adoptModifier(1, plural, createConstantModifier(status));
            setNumberProperties(0, plural);
            pm->adoptModifier(0, plural, createConstantModifier(status));
            setNumberProperties(-1, plural);
            pm->adoptModifier(-1, plural, createConstantModifier(status));
        }
        if (U_FAILURE(status)) {
            delete pm;
            return nullptr;
        }
        return new ImmutablePatternModifier(pm, fRules, parent);  // adopts pm
    } else {
        // Faster path when plural keyword is not needed.
        setNumberProperties(1, StandardPlural::Form::COUNT);
        pm->adoptModifierWithoutPlural(1, createConstantModifier(status));
        setNumberProperties(0, StandardPlural::Form::COUNT);
        pm->adoptModifierWithoutPlural(0, createConstantModifier(status));
        setNumberProperties(-1, StandardPlural::Form::COUNT);
        pm->adoptModifierWithoutPlural(-1, createConstantModifier(status));
        if (U_FAILURE(status)) {
            delete pm;
            return nullptr;
        }
        return new ImmutablePatternModifier(pm, nullptr, parent);  // adopts pm
    }
}